

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::IsFrozen
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance)

{
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this_local;
  
  return 0;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsFrozen(DynamicObject* instance)
    {
        if (!IsNotExtensibleSupported)
        {
            return false;
        }

        BYTE flags = this->GetFlags();
        if (flags & IsFrozenOnceFlag)
        {
            // Once frozen, there is no way to undo freeze.
            // But note: still, it can also be frozen when the flag is not set.
            return true;
        }

        if (this->GetFlags() & IsExtensibleFlag)
        {
            return false;
        }

        SimpleDictionaryPropertyDescriptor<TPropertyIndex> *descriptor = nullptr;
        for (TPropertyIndex index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if ((!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal)))
            {
                // [[Configurable]] and [[Configurable]] must be false for all (existing) properties.
                // IE9 compatibility: keep IE9 behavior (also check deleted properties)
                if (descriptor->Attributes & PropertyConfigurable)
                {
                    return false;
                }

                if (descriptor->Attributes & PropertyWritable)
                {
                    return false;
                }
            }
        }

        // Use IsObjectArrayFrozen() to skip "length" [[Writable]] check
        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray && !objectArray->IsObjectArrayFrozen())
        {
            return false;
        }

        if (DynamicObject::IsAnyTypedArray(instance))
        {
            auto typedArray = static_cast<TypedArrayBase*>(instance);
            if (!typedArray->IsObjectArrayFrozen())
            {
                return false;
            }
        }

        // Since we've determined that the object was frozen, set the flag to avoid further checks into all properties
        // (once frozen there is no way to go back to un-frozen).
        this->SetFlags(IsSealedOnceFlag | IsFrozenOnceFlag);

        return true;
    }